

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall
cppcms::widgets::base_widget::render_attributes(base_widget *this,form_context *context)

{
  ostream *poVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  
  auto_generate(this,context);
  poVar1 = form_context::out(context);
  if ((this->id_)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"id=\"",4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(this->id_)._M_dataplus._M_p,(this->id_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ",2);
  }
  if ((this->name_)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"name=\"",6);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(this->name_)._M_dataplus._M_p,(this->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ",2);
  }
  if ((this->field_0x1f0 & 4) == 0) {
    return;
  }
  if (context->html_type_ == 1) {
    pcVar4 = "disabled=\"disabled\" ";
    lVar3 = 0x14;
  }
  else {
    pcVar4 = "disabled ";
    lVar3 = 9;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar4,lVar3);
  return;
}

Assistant:

void base_widget::render_attributes(form_context &context)
{
	auto_generate(&context);
	std::ostream &output = context.out();
	if(!id_.empty()) output << "id=\"" << id_ << "\" ";
	if(!name_.empty()) output << "name=\"" << name_ << "\" ";
	if(disabled()) {
		if(context.html() == as_xhtml)
			output << "disabled=\"disabled\" ";
		else
			output << "disabled ";
	}
}